

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memenv.cc
# Opt level: O2

Status __thiscall leveldb::anon_unknown_2::InMemoryEnv::RemoveFile(InMemoryEnv *this,string *fname)

{
  iterator iVar1;
  key_type *in_RDX;
  Slice local_40;
  Slice local_30;
  
  std::mutex::lock((mutex *)&fname->field_2);
  iVar1 = std::
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_leveldb::(anonymous_namespace)::FileState_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_leveldb::(anonymous_namespace)::FileState_*>_>_>
          ::find((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_leveldb::(anonymous_namespace)::FileState_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_leveldb::(anonymous_namespace)::FileState_*>_>_>
                  *)((long)&fname[1].field_2 + 8),in_RDX);
  if (iVar1._M_node == (_Base_ptr)(fname + 2)) {
    local_30.data_ = (in_RDX->_M_dataplus)._M_p;
    local_30.size_ = in_RDX->_M_string_length;
    local_40.data_ = "File not found";
    local_40.size_ = 0xe;
    Status::IOError((Status *)this,&local_30,&local_40);
  }
  else {
    RemoveFileInternal((InMemoryEnv *)fname,in_RDX);
    (this->super_EnvWrapper).super_Env._vptr_Env = (_func_int **)0x0;
  }
  pthread_mutex_unlock((pthread_mutex_t *)&fname->field_2);
  return (Status)(char *)this;
}

Assistant:

Status RemoveFile(const std::string& fname) override {
    MutexLock lock(&mutex_);
    if (file_map_.find(fname) == file_map_.end()) {
      return Status::IOError(fname, "File not found");
    }

    RemoveFileInternal(fname);
    return Status::OK();
  }